

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *param_1)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint _c;
  _func_int *p_Var4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  bool bVar9;
  int k;
  uint uVar10;
  int iVar11;
  undefined4 *puVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int k_2;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  Mat *this_00;
  long lVar27;
  undefined4 *puVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  undefined4 *puVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  bool bVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  
  p_Var4 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var4) != 0) {
    return 0;
  }
  uVar3 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
  lVar20 = (long)(int)uVar3;
  uVar38 = (ulong)uVar3;
  uVar8 = (long)*(int *)(&this->field_0xf0 + (long)p_Var4) / (long)(int)uVar3;
  _c = *(uint *)(&this->field_0xd0 + (long)p_Var4);
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)(int)_c;
  this_00 = &this->weight_data_tm;
  uVar10 = (uint)uVar8;
  if ((long)(int)_c < 4) {
    if ((int)_c < 2) {
      if ((int)uVar10 < 4) {
        uVar17 = uVar10;
        uVar15 = uVar3;
        if (1 < (int)uVar10) {
          uVar17 = (uVar10 & 1) + 1;
          uVar15 = uVar3 * 2;
        }
        uVar19 = 0;
        Mat::create(this_00,uVar15,uVar17,_c,4,(Allocator *)0x0);
        goto LAB_004ee767;
      }
      iVar24 = uVar3 * 4;
      uVar17 = (uVar10 & 1) + (uVar10 >> 2) + (uint)((uVar10 >> 1 & 1) != 0);
      uVar15 = _c;
    }
    else {
      if ((int)uVar10 < 4) {
        if ((int)uVar10 < 2) {
          iVar24 = uVar3 * 2;
          uVar17 = uVar10;
          uVar15 = (_c & 1) + 1;
          goto LAB_004ee73e;
        }
        iVar24 = uVar3 * 4;
        uVar17 = (uVar10 & 1) + 1;
      }
      else {
        uVar17 = (uVar10 & 1) + (uVar10 >> 2) + (uint)((uVar10 >> 1 & 1) != 0);
        iVar24 = uVar3 * 8;
      }
      uVar15 = (_c & 1) + 1;
    }
LAB_004ee73e:
    uVar19 = 0;
    Mat::create(this_00,iVar24,uVar17,uVar15,4,(Allocator *)0x0);
    goto LAB_004ee767;
  }
  if ((int)uVar10 < 4) {
    if (1 < (int)uVar10) {
      iVar24 = uVar3 * 8;
      uVar17 = (uVar10 & 1) + 1;
      goto LAB_004ee272;
    }
    iVar24 = uVar3 * 4;
    iVar13 = (_c & 1) + (_c >> 2) + (uint)((_c >> 1 & 1) != 0);
    uVar17 = uVar10;
  }
  else {
    iVar24 = uVar3 << 4;
    uVar17 = (uVar10 & 1) + (int)((uVar8 & 0xffffffff) >> 2) + (uint)((uVar10 >> 1 & 1) != 0);
LAB_004ee272:
    iVar13 = (_c & 1) + (_c >> 2) + (uint)((_c >> 1 & 1) != 0);
  }
  Mat::create(this_00,iVar24,uVar17,iVar13,4,(Allocator *)0x0);
  lVar35 = *(long *)(&this->field_0x148 + (long)p_Var4);
  iVar14 = uVar10 * uVar3;
  sVar5 = (this->weight_data_tm).elemsize;
  sVar6 = (this->weight_data_tm).cstep;
  pvVar7 = (this->weight_data_tm).data;
  iVar11 = uVar3 * uVar10;
  iVar24 = iVar11 * 4;
  lVar18 = uVar38 * 0x10;
  lVar1 = lVar20 * 4;
  iVar13 = iVar11 * 3;
  iVar11 = iVar11 * 2;
  lVar2 = lVar20 * 8;
  iVar26 = 0;
  uVar16 = 0;
  do {
    puVar33 = (undefined4 *)((uVar16 >> 2) * sVar5 * sVar6 + (long)pvVar7);
    if ((int)uVar10 < 4) {
      uVar19 = 0;
    }
    else {
      lVar30 = lVar35 + (long)iVar26 * 4;
      lVar40 = lVar35 + (long)iVar14 * 4;
      lVar21 = lVar35 + (long)iVar11 * 4;
      lVar27 = lVar35 + (long)iVar13 * 4;
      uVar32 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar19 = 0;
          lVar25 = lVar27;
          lVar36 = lVar21;
          lVar39 = lVar40;
          lVar41 = lVar30;
          do {
            puVar22 = puVar33;
            lVar34 = 0;
            lVar29 = 0;
            do {
              *(undefined4 *)((long)puVar22 + lVar29) = *(undefined4 *)(lVar41 + lVar34);
              *(undefined4 *)((long)puVar22 + lVar29 + 4) = *(undefined4 *)(lVar39 + lVar34);
              *(undefined4 *)((long)puVar22 + lVar29 + 8) = *(undefined4 *)(lVar36 + lVar34);
              *(undefined4 *)((long)puVar22 + lVar29 + 0xc) = *(undefined4 *)(lVar25 + lVar34);
              lVar29 = lVar29 + 0x10;
              lVar34 = lVar34 + lVar1;
            } while ((int)lVar29 != 0x40);
            uVar19 = uVar19 + 1;
            lVar41 = lVar41 + 4;
            lVar39 = lVar39 + 4;
            lVar36 = lVar36 + 4;
            lVar25 = lVar25 + 4;
            puVar33 = (undefined4 *)(lVar29 + (long)puVar22);
          } while (uVar19 != uVar38);
          puVar33 = (undefined4 *)((long)puVar22 + lVar29);
        }
        uVar19 = uVar32 + 4;
        lVar25 = uVar32 + 7;
        lVar30 = lVar30 + lVar18;
        lVar40 = lVar40 + lVar18;
        lVar21 = lVar21 + lVar18;
        lVar27 = lVar27 + lVar18;
        uVar32 = uVar19;
      } while (lVar25 < (int)uVar10);
    }
    lVar21 = (long)iVar13 * 4;
    lVar30 = (long)iVar11 * 4;
    lVar40 = (long)iVar14 * 4;
    lVar27 = (long)iVar26 * 4;
    if ((int)((uint)uVar19 | 1) < (int)uVar10) {
      lVar36 = lVar1 * (uVar19 & 0xffffffff);
      lVar25 = lVar27 + lVar36 + lVar35;
      lVar41 = lVar36 + lVar21 + lVar35;
      lVar39 = lVar36 + lVar30 + lVar35;
      lVar36 = lVar36 + lVar40 + lVar35;
      uVar32 = uVar19 & 0xffffffff;
      do {
        if (0 < (int)uVar3) {
          uVar19 = 0;
          lVar29 = lVar25;
          lVar34 = lVar39;
          lVar31 = lVar41;
          lVar42 = lVar36;
          do {
            lVar23 = 0;
            bVar9 = true;
            do {
              bVar37 = bVar9;
              *puVar33 = *(undefined4 *)(lVar29 + lVar23);
              puVar33[1] = *(undefined4 *)(lVar42 + lVar23);
              puVar33[2] = *(undefined4 *)(lVar34 + lVar23);
              puVar33[3] = *(undefined4 *)(lVar31 + lVar23);
              puVar33 = puVar33 + 4;
              lVar23 = lVar23 + lVar1;
              bVar9 = false;
            } while (bVar37);
            uVar19 = uVar19 + 1;
            lVar29 = lVar29 + 4;
            lVar31 = lVar31 + 4;
            lVar34 = lVar34 + 4;
            lVar42 = lVar42 + 4;
          } while (uVar19 != uVar38);
        }
        uVar19 = uVar32 + 2;
        lVar29 = uVar32 + 3;
        lVar25 = lVar25 + lVar2;
        lVar41 = lVar41 + lVar2;
        lVar39 = lVar39 + lVar2;
        lVar36 = lVar36 + lVar2;
        uVar32 = uVar19;
      } while (lVar29 < (int)uVar10);
    }
    if ((int)uVar19 < (int)uVar10) {
      uVar19 = uVar19 & 0xffffffff;
      lVar25 = lVar1 * uVar19;
      lVar21 = lVar21 + lVar25 + lVar35;
      lVar30 = lVar30 + lVar25 + lVar35;
      lVar40 = lVar40 + lVar25 + lVar35;
      lVar27 = lVar25 + lVar27 + lVar35;
      do {
        if (0 < (int)uVar3) {
          lVar25 = 0;
          puVar22 = puVar33;
          do {
            puVar12 = puVar22;
            puVar22 = puVar33 + lVar25;
            *puVar22 = *(undefined4 *)(lVar27 + lVar25);
            puVar22[1] = *(undefined4 *)(lVar40 + lVar25);
            puVar22[2] = *(undefined4 *)(lVar30 + lVar25);
            puVar22[3] = *(undefined4 *)(lVar21 + lVar25);
            lVar25 = lVar25 + 4;
            puVar22 = puVar22 + 4;
          } while (uVar38 * 4 != lVar25);
          puVar33 = puVar12 + 4;
        }
        uVar19 = uVar19 + 1;
        lVar21 = lVar21 + lVar1;
        lVar30 = lVar30 + lVar1;
        lVar40 = lVar40 + lVar1;
        lVar27 = lVar27 + lVar1;
      } while (uVar19 != (uVar8 & 0xffffffff));
    }
    uVar19 = uVar16 + 4;
    uVar32 = uVar16 + 7;
    iVar26 = iVar26 + iVar24;
    iVar14 = iVar14 + iVar24;
    iVar11 = iVar11 + iVar24;
    iVar13 = iVar13 + iVar24;
    uVar16 = uVar19;
  } while (uVar32 < _c);
LAB_004ee767:
  uVar17 = (uint)uVar19 | 1;
  if ((int)uVar17 < (int)_c) {
    lVar30 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar7 = (this->weight_data_tm).data;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    lVar1 = lVar30 + (long)(int)(uVar3 * 3) * 4;
    iVar13 = uVar17 * uVar3 * uVar10;
    iVar24 = uVar3 * uVar10 * 2;
    lVar40 = uVar38 * 0x10;
    lVar2 = lVar30 + (long)(int)(uVar3 * 2) * 4;
    lVar18 = lVar20 * 4;
    lVar35 = lVar30 + lVar20 * 4;
    iVar11 = uVar3 * uVar10 * (uint)uVar19;
    uVar16 = uVar19 & 0xffffffff;
    do {
      lVar27 = (long)iVar13;
      lVar21 = (long)iVar11;
      puVar33 = (undefined4 *)
                ((ulong)(((uint)(uVar16 >> 2) & 0x3fffffff) + (uint)(((uint)uVar16 >> 1 & 1) != 0))
                 * sVar5 * sVar6 + (long)pvVar7);
      if ((int)uVar10 < 4) {
        uVar19 = 0;
      }
      else {
        lVar25 = lVar1 + lVar27 * 4;
        lVar36 = lVar2 + lVar27 * 4;
        lVar39 = lVar35 + lVar27 * 4;
        lVar41 = lVar30 + lVar27 * 4;
        lVar29 = lVar1 + lVar21 * 4;
        lVar34 = lVar2 + lVar21 * 4;
        lVar31 = lVar35 + lVar21 * 4;
        lVar42 = lVar30 + lVar21 * 4;
        uVar32 = 0;
        do {
          if (0 < (int)uVar3) {
            lVar23 = 0;
            puVar22 = puVar33;
            do {
              puVar12 = puVar22;
              puVar22 = puVar33 + lVar23 * 2;
              *puVar22 = *(undefined4 *)(lVar42 + lVar23);
              puVar22[1] = *(undefined4 *)(lVar31 + lVar23);
              puVar22[2] = *(undefined4 *)(lVar34 + lVar23);
              puVar22[3] = *(undefined4 *)(lVar29 + lVar23);
              puVar22[4] = *(undefined4 *)(lVar41 + lVar23);
              puVar22[5] = *(undefined4 *)(lVar39 + lVar23);
              puVar22[6] = *(undefined4 *)(lVar36 + lVar23);
              puVar22[7] = *(undefined4 *)(lVar25 + lVar23);
              lVar23 = lVar23 + 4;
              puVar22 = puVar22 + 8;
            } while (uVar38 * 4 != lVar23);
            puVar33 = puVar12 + 8;
          }
          uVar19 = uVar32 + 4;
          lVar23 = uVar32 + 7;
          lVar25 = lVar25 + lVar40;
          lVar36 = lVar36 + lVar40;
          lVar39 = lVar39 + lVar40;
          lVar41 = lVar41 + lVar40;
          lVar29 = lVar29 + lVar40;
          lVar34 = lVar34 + lVar40;
          lVar31 = lVar31 + lVar40;
          lVar42 = lVar42 + lVar40;
          uVar32 = uVar19;
        } while (lVar23 < (int)uVar10);
      }
      if ((int)((uint)uVar19 | 1) < (int)uVar10) {
        lVar25 = lVar18 * (uVar19 & 0xffffffff);
        lVar36 = lVar25 + lVar27 * 4 + lVar30;
        lVar25 = lVar25 + lVar21 * 4 + lVar30;
        uVar32 = uVar19 & 0xffffffff;
        do {
          if (0 < (int)uVar3) {
            uVar19 = 0;
            lVar39 = lVar25;
            lVar41 = lVar36;
            do {
              lVar29 = 0;
              bVar9 = true;
              do {
                bVar37 = bVar9;
                *puVar33 = *(undefined4 *)(lVar39 + lVar29);
                puVar33[1] = *(undefined4 *)(lVar41 + lVar29);
                puVar33 = puVar33 + 2;
                lVar29 = lVar29 + lVar18;
                bVar9 = false;
              } while (bVar37);
              uVar19 = uVar19 + 1;
              lVar41 = lVar41 + 4;
              lVar39 = lVar39 + 4;
            } while (uVar19 != uVar38);
          }
          uVar19 = uVar32 + 2;
          lVar39 = uVar32 + 3;
          lVar36 = lVar36 + lVar20 * 8;
          lVar25 = lVar25 + lVar20 * 8;
          uVar32 = uVar19;
        } while (lVar39 < (int)uVar10);
      }
      if ((int)uVar19 < (int)uVar10) {
        uVar19 = uVar19 & 0xffffffff;
        lVar27 = lVar27 * 4 + lVar18 * uVar19 + lVar30;
        lVar21 = lVar18 * uVar19 + lVar21 * 4 + lVar30;
        do {
          if (0 < (int)uVar3) {
            uVar32 = 0;
            do {
              *puVar33 = *(undefined4 *)(lVar21 + uVar32 * 4);
              puVar33[1] = *(undefined4 *)(lVar27 + uVar32 * 4);
              puVar33 = puVar33 + 2;
              uVar32 = uVar32 + 1;
            } while (uVar38 != uVar32);
          }
          uVar19 = uVar19 + 1;
          lVar27 = lVar27 + lVar18;
          lVar21 = lVar21 + lVar18;
        } while (uVar19 != (uVar8 & 0xffffffff));
      }
      uVar19 = uVar16 + 2;
      lVar21 = uVar16 + 3;
      iVar13 = iVar13 + iVar24;
      iVar11 = iVar11 + iVar24;
      uVar16 = uVar19;
    } while (lVar21 < (int)_c);
  }
  if ((int)uVar19 < (int)_c) {
    lVar2 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar7 = (this->weight_data_tm).data;
    sVar5 = (this->weight_data_tm).elemsize;
    sVar6 = (this->weight_data_tm).cstep;
    uVar16 = uVar19 & 0xffffffff;
    iVar24 = uVar3 * uVar10 * (int)uVar19;
    lVar1 = lVar20 * 4;
    do {
      puVar33 = (undefined4 *)
                ((ulong)(((uint)uVar16 & 1) + ((uint)(uVar16 >> 2) & 0x3fffffff) +
                        (uint)(((uint)uVar16 >> 1 & 1) != 0)) * sVar5 * sVar6 + (long)pvVar7);
      if ((int)uVar10 < 4) {
        uVar19 = 0;
      }
      else {
        puVar22 = (undefined4 *)(lVar2 + (long)iVar24 * 4);
        uVar32 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar19 = 0;
            puVar12 = puVar22;
            do {
              puVar28 = puVar33;
              lVar35 = 0;
              puVar33 = puVar12;
              do {
                *(undefined4 *)((long)puVar28 + lVar35) = *puVar33;
                lVar35 = lVar35 + 4;
                puVar33 = puVar33 + lVar20;
              } while ((int)lVar35 != 0x10);
              uVar19 = uVar19 + 1;
              puVar12 = puVar12 + 1;
              puVar33 = (undefined4 *)(lVar35 + (long)puVar28);
            } while (uVar19 != uVar38);
            puVar33 = (undefined4 *)((long)puVar28 + lVar35);
          }
          uVar19 = uVar32 + 4;
          lVar35 = uVar32 + 7;
          puVar22 = puVar22 + uVar38 * 4;
          uVar32 = uVar19;
        } while (lVar35 < (int)uVar10);
      }
      lVar35 = (long)iVar24 * 4;
      if ((int)((uint)uVar19 | 1) < (int)uVar10) {
        uVar32 = uVar19 & 0xffffffff;
        lVar18 = (uVar32 * 4 + 4) * lVar20 + lVar2 + lVar35;
        lVar30 = lVar1 * uVar32 + lVar35 + lVar2;
        do {
          if (0 < (int)uVar3) {
            uVar19 = 0;
            do {
              *puVar33 = *(undefined4 *)(lVar30 + uVar19 * 4);
              puVar33[1] = *(undefined4 *)(lVar18 + uVar19 * 4);
              puVar33 = puVar33 + 2;
              uVar19 = uVar19 + 1;
            } while (uVar38 != uVar19);
          }
          uVar19 = uVar32 + 2;
          lVar40 = uVar32 + 3;
          lVar18 = lVar18 + lVar20 * 8;
          lVar30 = lVar30 + lVar20 * 8;
          uVar32 = uVar19;
        } while (lVar40 < (int)uVar10);
      }
      if ((int)uVar19 < (int)uVar10) {
        uVar19 = uVar19 & 0xffffffff;
        lVar35 = lVar1 * uVar19 + lVar35 + lVar2;
        do {
          if (0 < (int)uVar3) {
            lVar18 = 0;
            do {
              *(undefined4 *)((long)puVar33 + lVar18) = *(undefined4 *)(lVar35 + lVar18);
              lVar18 = lVar18 + 4;
            } while (uVar38 * 4 - lVar18 != 0);
            puVar33 = (undefined4 *)((long)puVar33 + lVar18);
          }
          uVar19 = uVar19 + 1;
          lVar35 = lVar35 + lVar1;
        } while (uVar19 != (uVar8 & 0xffffffff));
      }
      uVar16 = uVar16 + 1;
      iVar24 = iVar24 + uVar3 * uVar10;
    } while (uVar16 != _c);
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}